

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetOutputName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  undefined8 this_00;
  iterator iVar1;
  cmake *this_01;
  char *pcVar2;
  pointer prop;
  pair<std::_Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar3;
  string outName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string configUpper;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string type;
  undefined1 local_e0 [32];
  cmGeneratorExpression ge;
  value_type entry;
  OutputNameKey key;
  
  std::__cxx11::string::string((string *)&key,(string *)config);
  key.second = artifact;
  iVar1 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->OutputNameMap)._M_t,&key);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->OutputNameMap)._M_t._M_impl.super__Rb_tree_header)
  {
    if (iVar1._M_node[2]._M_left == (_Base_ptr)0x0) {
      this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::operator+(&type,"Target \'",&this->Target->Name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&entry,
                     &type,"\' OUTPUT_NAME depends on itself.");
      GetBacktrace((cmListFileBacktrace *)&configUpper,this);
      cmake::IssueMessage(this_01,FATAL_ERROR,(string *)&entry,(cmListFileBacktrace *)&configUpper);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&configUpper);
      std::__cxx11::string::~string((string *)&entry);
      std::__cxx11::string::~string((string *)&type);
    }
    goto LAB_00368d37;
  }
  std::
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_&,_const_char_(&)[1],_true>
            (&entry,&key,(char (*) [1])0x53a5ca);
  pVar3 = std::
          _Rb_tree<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>,std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>>
          ::
          _M_emplace_unique<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>&>
                    ((_Rb_tree<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>,std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>,std::_Select1st<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>>
                      *)&this->OutputNameMap,&entry);
  iVar1._M_node = (_Base_ptr)pVar3.first._M_node;
  props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = GetOutputTargetType(this,artifact);
  std::__cxx11::string::string((string *)&type,pcVar2,(allocator *)&configUpper);
  cmsys::SystemTools::UpperCase(&configUpper,config);
  if (type._M_string_length != 0) {
    if (configUpper._M_string_length != 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ge,&type,
                     "_OUTPUT_NAME_");
      std::operator+(&outName,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ge,&configUpper);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,
                 &outName);
      std::__cxx11::string::~string((string *)&outName);
      std::__cxx11::string::~string((string *)&ge);
      if (type._M_string_length == 0) goto LAB_00368b43;
    }
    std::operator+(&outName,&type,"_OUTPUT_NAME");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,&outName)
    ;
    std::__cxx11::string::~string((string *)&outName);
  }
LAB_00368b43:
  if (configUpper._M_string_length != 0) {
    std::operator+(&outName,"OUTPUT_NAME_",&configUpper);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,&outName)
    ;
    std::__cxx11::string::~string((string *)&outName);
    std::operator+(&outName,&configUpper,"_OUTPUT_NAME");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,&outName)
    ;
    std::__cxx11::string::~string((string *)&outName);
  }
  std::__cxx11::string::string((string *)&outName,"OUTPUT_NAME",(allocator *)&ge);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&props,&outName);
  std::__cxx11::string::~string((string *)&outName);
  outName._M_dataplus._M_p = (pointer)&outName.field_2;
  outName._M_string_length = 0;
  outName.field_2._M_local_buf[0] = '\0';
  prop = props.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (prop == props.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00368c19;
    pcVar2 = GetProperty(this,prop);
    prop = prop + 1;
  } while (pcVar2 == (char *)0x0);
  std::__cxx11::string::assign((char *)&outName);
LAB_00368c19:
  if (outName._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&outName);
  }
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_e0);
  cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)local_e0);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_e0);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_e0,(string *)&ge);
  this_00 = local_e0._0_8_;
  local_e0._0_8_ = (cmState *)0x0;
  cge.x_ = (cmCompiledGeneratorExpression *)this_00;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_e0);
  local_e0._0_8_ = local_e0 + 0x10;
  local_e0._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  local_e0[0x10] = '\0';
  cmCompiledGeneratorExpression::Evaluate
            ((cmCompiledGeneratorExpression *)this_00,this->LocalGenerator,config,false,
             (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
             (cmGeneratorExpressionDAGChecker *)0x0,(string *)local_e0);
  std::__cxx11::string::assign((char *)&iVar1._M_node[2]._M_parent);
  std::__cxx11::string::~string((string *)local_e0);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  std::__cxx11::string::~string((string *)&outName);
  std::__cxx11::string::~string((string *)&configUpper);
  std::__cxx11::string::~string((string *)&type);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&props);
  std::
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&entry);
LAB_00368d37:
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&iVar1._M_node[2]._M_parent);
  std::__cxx11::string::~string((string *)&key);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetOutputName(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  // Lookup/compute/cache the output name for this configuration.
  OutputNameKey key(config, artifact);
  cmGeneratorTarget::OutputNameMapType::iterator i =
    this->OutputNameMap.find(key);
  if (i == this->OutputNameMap.end()) {
    // Add empty name in map to detect potential recursion.
    OutputNameMapType::value_type entry(key, "");
    i = this->OutputNameMap.insert(entry).first;

    // Compute output name.
    std::vector<std::string> props;
    std::string type = this->GetOutputTargetType(artifact);
    std::string configUpper = cmSystemTools::UpperCase(config);
    if (!type.empty() && !configUpper.empty()) {
      // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME_<CONFIG>
      props.push_back(type + "_OUTPUT_NAME_" + configUpper);
    }
    if (!type.empty()) {
      // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME
      props.push_back(type + "_OUTPUT_NAME");
    }
    if (!configUpper.empty()) {
      // OUTPUT_NAME_<CONFIG>
      props.push_back("OUTPUT_NAME_" + configUpper);
      // <CONFIG>_OUTPUT_NAME
      props.push_back(configUpper + "_OUTPUT_NAME");
    }
    // OUTPUT_NAME
    props.push_back("OUTPUT_NAME");

    std::string outName;
    for (std::vector<std::string>::const_iterator it = props.begin();
         it != props.end(); ++it) {
      if (const char* outNameProp = this->GetProperty(*it)) {
        outName = outNameProp;
        break;
      }
    }

    if (outName.empty()) {
      outName = this->GetName();
    }

    // Now evaluate genex and update the previously-prepared map entry.
    cmGeneratorExpression ge;
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(outName);
    i->second = cge->Evaluate(this->LocalGenerator, config);
  } else if (i->second.empty()) {
    // An empty map entry indicates we have been called recursively
    // from the above block.
    this->LocalGenerator->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR,
      "Target '" + this->GetName() + "' OUTPUT_NAME depends on itself.",
      this->GetBacktrace());
  }
  return i->second;
}